

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.c
# Opt level: O0

_Bool do_constant_folding_cond_eq(TCGCond c)

{
  TCGCond c_local;
  
  if (c != TCG_COND_LT) {
    if (c == TCG_COND_GE) {
      return true;
    }
    if (c != TCG_COND_LTU) {
      if (c == TCG_COND_GEU) {
        return true;
      }
      if (c == TCG_COND_EQ) {
        return true;
      }
      if (c != TCG_COND_NE) {
        if (c == TCG_COND_LE) {
          return true;
        }
        if (c != TCG_COND_GT) {
          if (c == TCG_COND_LEU) {
            return true;
          }
          if (c != TCG_COND_GTU) {
            fprintf(_stderr,"%s:%d: tcg fatal error\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/optimize.c"
                    ,499);
            abort();
          }
        }
      }
    }
  }
  return false;
}

Assistant:

static bool do_constant_folding_cond_eq(TCGCond c)
{
    switch (c) {
    case TCG_COND_GT:
    case TCG_COND_LTU:
    case TCG_COND_LT:
    case TCG_COND_GTU:
    case TCG_COND_NE:
        return 0;
    case TCG_COND_GE:
    case TCG_COND_GEU:
    case TCG_COND_LE:
    case TCG_COND_LEU:
    case TCG_COND_EQ:
        return 1;
    default:
        tcg_abort();
    }
}